

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# isotpsniffer.c
# Opt level: O0

void printbuf(uchar *buffer,int nbytes,int color,int timestamp,int format,timeval *tv,
             timeval *last_tv,canid_t src,int socket,char *candevice,int head)

{
  tm *__src;
  ushort **ppuVar1;
  int in_ECX;
  int in_EDX;
  uint in_ESI;
  long in_RDI;
  uint in_R8D;
  time_t *in_R9;
  long *in_stack_00000008;
  timeval diff;
  char timestring [25];
  tm tm;
  int i;
  long local_98;
  long local_90;
  char local_88 [40];
  tm local_60;
  int local_24;
  time_t *local_20;
  uint local_18;
  int local_14;
  int local_10;
  uint local_c;
  long local_8;
  
  local_20 = in_R9;
  local_18 = in_R8D;
  local_14 = in_ECX;
  local_10 = in_EDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  if (in_EDX == 1) {
    printf("%s","\x1b[31m");
  }
  if (local_10 == 2) {
    printf("%s","\x1b[34m");
  }
  if (local_14 != 0) {
    ioctl((int)diff.tv_usec,0x8906,local_20);
    if (local_14 == 0x41) {
      __src = localtime(local_20);
      memcpy(&local_60,__src,0x38);
      strftime(local_88,0x18,"%Y-%m-%d %H:%M:%S",&local_60);
      printf("(%s.%06llu) ",local_88,local_20[1]);
    }
    else if (local_14 == 0x61) {
      printf("(%llu.%06llu) ",*local_20,local_20[1]);
    }
    else if ((local_14 == 100) || (local_14 == 0x7a)) {
      if (*in_stack_00000008 == 0) {
        *in_stack_00000008 = *local_20;
        in_stack_00000008[1] = local_20[1];
      }
      local_98 = *local_20 - *in_stack_00000008;
      local_90 = local_20[1] - in_stack_00000008[1];
      if (local_90 < 0) {
        local_98 = local_98 + -1;
        local_90 = local_90 + 1000000;
      }
      if (local_98 < 0) {
        local_90 = 0;
        local_98 = 0;
      }
      printf("(%llu.%06llu) ",local_98,local_90);
      if (local_14 == 100) {
        *in_stack_00000008 = *local_20;
        in_stack_00000008[1] = local_20[1];
      }
    }
  }
  printf(" %s  %03X  [%d]  ",timestring._0_8_,(ulong)((uint)diff.tv_sec & 0x1fffffff),(ulong)local_c
        );
  if ((local_18 & 1) != 0) {
    for (local_24 = 0; local_24 < (int)local_c; local_24 = local_24 + 1) {
      printf("%02X ",(ulong)*(byte *)(local_8 + local_24));
      if ((timestring._8_4_ != 0) && ((int)timestring._8_4_ <= local_24 + 1)) {
        printf("... ");
        break;
      }
    }
    if ((local_18 & 2) != 0) {
      printf(" - ");
    }
  }
  if ((local_18 & 2) != 0) {
    printf("\'");
    for (local_24 = 0; local_24 < (int)local_c; local_24 = local_24 + 1) {
      ppuVar1 = __ctype_b_loc();
      if (((*ppuVar1)[(int)(uint)*(byte *)(local_8 + local_24)] & 0x4000) == 0) {
        printf(".");
      }
      else {
        printf("%c",(ulong)*(byte *)(local_8 + local_24));
      }
      if ((timestring._8_4_ != 0) && ((int)timestring._8_4_ <= local_24 + 1)) break;
    }
    printf("\'");
    if ((timestring._8_4_ != 0) && ((int)timestring._8_4_ <= local_24 + 1)) {
      printf(" ... ");
    }
  }
  if (local_10 != 0) {
    printf("%s","\x1b[0m");
  }
  printf("\n");
  fflush(_stdout);
  return;
}

Assistant:

void printbuf(unsigned char *buffer, int nbytes, int color, int timestamp,
	      int format, struct timeval *tv, struct timeval *last_tv,
	      canid_t src, int socket, char *candevice, int head)
{
	int i;

	if (color == 1)
		printf("%s", FGRED);

	if (color == 2)
		printf("%s", FGBLUE);

	if (timestamp) {
		ioctl(socket, SIOCGSTAMP, tv);

		switch (timestamp) {

		case 'a': /* absolute with timestamp */
			printf("(%llu.%06llu) ", (unsigned long long)tv->tv_sec, (unsigned long long)tv->tv_usec);
			break;

		case 'A': /* absolute with date */
		{
			struct tm tm;
			char timestring[25];

			tm = *localtime(&tv->tv_sec);
			strftime(timestring, 24, "%Y-%m-%d %H:%M:%S", &tm);
			printf("(%s.%06llu) ", timestring, (unsigned long long)tv->tv_usec);
		}
		break;

		case 'd': /* delta */
		case 'z': /* starting with zero */
		{
			struct timeval diff;

			if (last_tv->tv_sec == 0)   /* first init */
				*last_tv = *tv;
			diff.tv_sec  = tv->tv_sec  - last_tv->tv_sec;
			diff.tv_usec = tv->tv_usec - last_tv->tv_usec;
			if (diff.tv_usec < 0)
				diff.tv_sec--, diff.tv_usec += 1000000;
			if (diff.tv_sec < 0)
				diff.tv_sec = diff.tv_usec = 0;
			printf("(%llu.%06llu) ", (unsigned long long)diff.tv_sec, (unsigned long long)diff.tv_usec);

			if (timestamp == 'd')
				*last_tv = *tv; /* update for delta calculation */
		}
		break;

		default: /* no timestamp output */
			break;
		}
	}

	/* the source socket gets pdu data from the destination id */
	printf(" %s  %03X  [%d]  ", candevice, src & CAN_EFF_MASK, nbytes);
	if (format & FORMAT_HEX) {
		for (i=0; i<nbytes; i++) {
			printf("%02X ", buffer[i]);
			if (head && i+1 >= head) {
				printf("... ");
				break;
			}
		}
		if (format & FORMAT_ASCII)
			printf(" - ");
	}
	if (format & FORMAT_ASCII) {
		printf("'");
		for (i=0; i<nbytes; i++) {
			if (isprint(buffer[i]))
				printf("%c", buffer[i]);
			else
				printf(".");
			if (head && i+1 >= head)
				break;
		}
		printf("'");
		if (head && i+1 >= head)
			printf(" ... ");
	}

	if (color)
		printf("%s", ATTRESET);

	printf("\n");
	fflush(stdout);
}